

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.cpp
# Opt level: O0

ExpansionBlock permutationBox(ExpansionBlock block)

{
  reference local_90;
  reference local_80;
  reference local_70;
  reference local_60 [2];
  reference local_40;
  reference local_30;
  int local_1c;
  _Base_bitset<1UL> _Stack_18;
  int i;
  ExpansionBlock block_local;
  ExpansionBlock result;
  
  _Stack_18 = block.super__Base_bitset<1UL>._M_w;
  std::bitset<32UL>::bitset(&block_local);
  for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
    std::bitset<32UL>::operator[]((bitset<32UL> *)&local_30,(size_t)&stack0xffffffffffffffe8);
    std::bitset<32UL>::operator[]((bitset<32UL> *)&local_40,(size_t)&block_local);
    std::bitset<32UL>::reference::operator=(&local_40,&local_30);
    std::bitset<32UL>::reference::~reference(&local_40);
    std::bitset<32UL>::reference::~reference(&local_30);
  }
  for (; local_1c < 0x18; local_1c = local_1c + 1) {
    std::bitset<32UL>::operator[]((bitset<32UL> *)local_60,(size_t)&stack0xffffffffffffffe8);
    std::bitset<32UL>::operator[]((bitset<32UL> *)&local_70,(size_t)&block_local);
    std::bitset<32UL>::reference::operator=(&local_70,local_60);
    std::bitset<32UL>::reference::~reference(&local_70);
    std::bitset<32UL>::reference::~reference(local_60);
  }
  for (; local_1c < 0x20; local_1c = local_1c + 1) {
    std::bitset<32UL>::operator[]((bitset<32UL> *)&local_80,(size_t)&stack0xffffffffffffffe8);
    std::bitset<32UL>::operator[]((bitset<32UL> *)&local_90,(size_t)&block_local);
    std::bitset<32UL>::reference::operator=(&local_90,&local_80);
    std::bitset<32UL>::reference::~reference(&local_90);
    std::bitset<32UL>::reference::~reference(&local_80);
  }
  return (ExpansionBlock)block_local.super__Base_bitset<1UL>._M_w._M_w;
}

Assistant:

ExpansionBlock permutationBox(ExpansionBlock block) {
    ExpansionBlock result;
    int i = 0;
    for ( ; i < EXPANSION_BLOCK_SIZE / 2; i++) {
        result[i] = block[EXPANSION_BLOCK_SIZE- i - 1];
    }

    for ( ; i < (EXPANSION_BLOCK_SIZE / 4) * 3; i++) {
        result[i] = block[i - 8];
    }

    for ( ; i < EXPANSION_BLOCK_SIZE; i++) {
        result[i] = block[EXPANSION_BLOCK_SIZE - i - 1];
    }

    return result;
}